

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

lws * wsi_from_fd(lws_context *context,int fd)

{
  lws **pplVar1;
  lws **done;
  lws **p;
  int fd_local;
  lws_context *context_local;
  
  if ((*(ushort *)&context->field_0x7b7 >> 10 & 1) == 0) {
    context_local = (lws_context *)context->lws_lookup[fd];
  }
  else {
    done = context->lws_lookup;
    pplVar1 = done + context->max_fds;
    for (; done != pplVar1; done = done + 1) {
      if ((*done != (lws *)0x0) && (((*done)->desc).sockfd == fd)) {
        return *done;
      }
    }
    context_local = (lws_context *)0x0;
  }
  return (lws *)context_local;
}

Assistant:

struct lws *
wsi_from_fd(const struct lws_context *context, int fd)
{
	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		return context->lws_lookup[fd - lws_plat_socket_offset()];

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	while (p != done) {
		if (*p && (*p)->desc.sockfd == fd)
			return *p;
		p++;
	}

	return NULL;
}